

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeferredTypeHandler.cpp
# Opt level: O0

DictionaryTypeHandlerBase<unsigned_short> * __thiscall
Js::DeferredTypeHandlerBase::ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
          (DeferredTypeHandlerBase *this,DynamicObject *instance,int initSlotCapacity,BOOL isProto)

{
  code *pcVar1;
  BYTE values;
  PropertyTypes values_00;
  bool bVar2;
  uint16 inlineSlotCapacity;
  uint16 offsetOfInlineSlots;
  int newCount;
  uint uVar3;
  ScriptContext *this_00;
  Recycler *recycler_00;
  DictionaryTypeHandlerBase<unsigned_short> *this_01;
  DynamicType *this_02;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar4;
  undefined4 *puVar5;
  DictionaryTypeHandlerBase<unsigned_short> *newTypeHandler;
  Recycler *recycler;
  ScriptContext *scriptContext;
  BOOL isProto_local;
  int initSlotCapacity_local;
  DynamicObject *instance_local;
  DeferredTypeHandlerBase *this_local;
  
  this_00 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  recycler_00 = ScriptContext::GetRecycler(this_00);
  inlineSlotCapacity = DynamicTypeHandler::GetInlineSlotCapacity(&this->super_DynamicTypeHandler);
  offsetOfInlineSlots = DynamicTypeHandler::GetOffsetOfInlineSlots(&this->super_DynamicTypeHandler);
  this_01 = DictionaryTypeHandlerBase<unsigned_short>::New
                      (recycler_00,initSlotCapacity,inlineSlotCapacity,offsetOfInlineSlots);
  DynamicTypeHandler::SetSingletonInstanceIfNeeded(&this_01->super_DynamicTypeHandler,instance);
  newCount = DynamicTypeHandler::GetSlotCapacity(&this_01->super_DynamicTypeHandler);
  DynamicObject::EnsureSlots(instance,0,newCount,this_00,&this_01->super_DynamicTypeHandler);
  values = DynamicTypeHandler::GetFlags(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetFlags(&this_01->super_DynamicTypeHandler,' ',values);
  values_00 = DynamicTypeHandler::GetPropertyTypes(&this->super_DynamicTypeHandler);
  DynamicTypeHandler::SetPropertyTypes(&this_01->super_DynamicTypeHandler,0xf0,values_00);
  uVar3 = (*(instance->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])();
  if ((uVar3 & 1) != 0) {
    DynamicTypeHandler::ClearHasOnlyWritableDataProperties(&this_01->super_DynamicTypeHandler);
  }
  if (isProto != 0) {
    (*(this_01->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x52])(this_01,instance);
  }
  DynamicTypeHandler::SetInstanceTypeHandler(&this_01->super_DynamicTypeHandler,instance,true);
  if (isProto != 0) {
    this_02 = DynamicObject::GetDynamicType(instance);
    pDVar4 = (DictionaryTypeHandlerBase<unsigned_short> *)DynamicType::GetTypeHandler(this_02);
    if (pDVar4 != this_01) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DeferredTypeHandler.cpp"
                                  ,0x8a,
                                  "(!isProto || instance->GetDynamicType()->GetTypeHandler() == newTypeHandler)"
                                  ,
                                  "Why did SetIsPrototype force a type handler change on a non-shared type handler?"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return this_01;
}

Assistant:

T* DeferredTypeHandlerBase::ConvertToTypeHandler(DynamicObject* instance, int initSlotCapacity, BOOL isProto)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();
        Recycler* recycler = scriptContext->GetRecycler();

        // Create new type handler, allowing slotCapacity round up here. We'll allocate instance slots below.
        T* newTypeHandler = T::New(recycler, initSlotCapacity, GetInlineSlotCapacity(), GetOffsetOfInlineSlots());
#if ENABLE_FIXED_FIELDS
        newTypeHandler->SetSingletonInstanceIfNeeded(instance);
#endif
        // EnsureSlots before updating the type handler and instance, as EnsureSlots allocates and may throw.
        instance->EnsureSlots(0, newTypeHandler->GetSlotCapacity(), scriptContext, newTypeHandler);
        newTypeHandler->SetFlags(IsPrototypeFlag, this->GetFlags());
        newTypeHandler->SetPropertyTypes(PropertyTypesWritableDataOnly | PropertyTypesWritableDataOnlyDetection | PropertyTypesInlineSlotCapacityLocked | PropertyTypesHasSpecialProperties, this->GetPropertyTypes());
        if (instance->HasReadOnlyPropertiesInvisibleToTypeHandler())
        {
            newTypeHandler->ClearHasOnlyWritableDataProperties();
        }

        if (isProto)
        {
            newTypeHandler->SetIsPrototype(instance);
        }

        newTypeHandler->SetInstanceTypeHandler(instance);
        AssertMsg(!isProto || instance->GetDynamicType()->GetTypeHandler() == newTypeHandler, "Why did SetIsPrototype force a type handler change on a non-shared type handler?");

        return newTypeHandler;
    }